

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

int __thiscall argparse::ArgumentParser::get<int>(ArgumentParser *this,string_view arg_name)

{
  int iVar1;
  Argument *this_00;
  logic_error *this_01;
  
  if (this->m_is_parsed != false) {
    this_00 = operator[](this,arg_name);
    iVar1 = Argument::get<int>(this_00);
    return iVar1;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"Nothing parsed, no arguments are available.");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T get(std::string_view arg_name) const {
    if (!m_is_parsed) {
      throw std::logic_error("Nothing parsed, no arguments are available.");
    }
    return (*this)[arg_name].get<T>();
  }